

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O0

void ares_process_pending_write(ares_channel_t *channel)

{
  ares_conn_t *conn_00;
  ares_status_t failure_status;
  void *pvVar1;
  ares_status_t status;
  ares_conn_t *conn;
  ares_server_t *server;
  ares_slist_node_t *node;
  ares_channel_t *channel_local;
  
  if (channel != (ares_channel_t *)0x0) {
    ares_channel_lock(channel);
    if (channel->notify_pending_write == ARES_FALSE) {
      ares_channel_unlock(channel);
    }
    else {
      channel->notify_pending_write = ARES_FALSE;
      for (server = (ares_server_t *)ares_slist_node_first(channel->servers);
          server != (ares_server_t *)0x0;
          server = (ares_server_t *)ares_slist_node_next((ares_slist_node_t *)server)) {
        pvVar1 = ares_slist_node_val((ares_slist_node_t *)server);
        conn_00 = *(ares_conn_t **)((long)pvVar1 + 0x80);
        if ((conn_00 != (ares_conn_t *)0x0) &&
           (failure_status = ares_conn_flush(conn_00), failure_status != ARES_SUCCESS)) {
          handle_conn_error(conn_00,ARES_TRUE,failure_status);
        }
      }
      ares_channel_unlock(channel);
    }
  }
  return;
}

Assistant:

void ares_process_pending_write(ares_channel_t *channel)
{
  ares_slist_node_t *node;

  if (channel == NULL) {
    return;
  }

  ares_channel_lock(channel);
  if (!channel->notify_pending_write) {
    ares_channel_unlock(channel);
    return;
  }

  /* Set as untriggerd before calling into ares_conn_flush(), this is
   * because its possible ares_conn_flush() might cause additional data to
   * be enqueued if there is some form of exception so it will need to recurse.
   */
  channel->notify_pending_write = ARES_FALSE;

  for (node = ares_slist_node_first(channel->servers); node != NULL;
       node = ares_slist_node_next(node)) {
    ares_server_t *server = ares_slist_node_val(node);
    ares_conn_t   *conn   = server->tcp_conn;
    ares_status_t  status;

    if (conn == NULL) {
      continue;
    }

    /* Enqueue any pending data if there is any */
    status = ares_conn_flush(conn);
    if (status != ARES_SUCCESS) {
      handle_conn_error(conn, ARES_TRUE, status);
    }
  }

  ares_channel_unlock(channel);
}